

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::BasicReporter(BasicReporter *this,ReporterConfig *config)

{
  ReporterConfig *config_local;
  BasicReporter *this_local;
  
  SharedImpl<Catch::IReporter>::SharedImpl(&this->super_SharedImpl<Catch::IReporter>);
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__BasicReporter_0029d4a8;
  ReporterConfig::ReporterConfig(&this->m_config,config);
  this->m_firstSectionInTestCase = true;
  SpanInfo::SpanInfo(&this->m_testingSpan);
  SpanInfo::SpanInfo(&this->m_groupSpan);
  SpanInfo::SpanInfo(&this->m_testSpan);
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  vector(&this->m_sectionSpans);
  this->m_aborted = false;
  return;
}

Assistant:

BasicReporter( const ReporterConfig& config )
        :   m_config( config ),
            m_firstSectionInTestCase( true ),
            m_aborted( false )
        {}